

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1.c
# Opt level: O3

int http1_on_response(http1_parser_s *parser)

{
  int iVar1;
  
  http_on_response_handler______internal
            ((http_s *)(parser + 1),*(http_settings_s **)&parser[-1].state.reserved);
  if ((parser[2].state.content_length != 0) && (parser[4].state.field_0x1a == '\0')) {
    http_finish((http_s *)(parser + 1));
  }
  parser[4].state.next = (uint8_t *)0x0;
  iVar1 = fio_is_closed((intptr_t)parser[-1].state.next);
  return iVar1;
}

Assistant:

static int http1_on_response(http1_parser_s *parser) {
  http1pr_s *p = parser2http(parser);
  http_on_response_handler______internal(&http1_pr2handle(p), p->p.settings);
  if (p->request.status_str && !p->stop)
    http_finish(&p->request);
  h1_reset(p);
  return fio_is_closed(p->p.uuid);
}